

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall btMultiBody::checkMotionAndSleepIfRequired(btMultiBody *this,btScalar timestep)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  
  if ((this->m_canSleep == true) && (!gDisableDeactivation)) {
    iVar2 = -6;
    if (-6 < this->m_dofCount) {
      iVar2 = this->m_dofCount;
    }
    fVar4 = 0.0;
    for (uVar3 = 0; iVar2 + 6 != uVar3; uVar3 = uVar3 + 1) {
      fVar1 = (this->m_realBuf).m_data[uVar3];
      fVar4 = fVar4 + fVar1 * fVar1;
    }
    if (0.05 <= fVar4) {
      this->m_sleepTimer = 0.0;
      if (this->m_awake == false) {
        this->m_awake = true;
      }
    }
    else {
      fVar4 = timestep + this->m_sleepTimer;
      this->m_sleepTimer = fVar4;
      if (2.0 < fVar4) {
        this->m_awake = false;
        return;
      }
    }
    return;
  }
  this->m_awake = true;
  this->m_sleepTimer = 0.0;
  return;
}

Assistant:

void btMultiBody::checkMotionAndSleepIfRequired(btScalar timestep)
{
	int num_links = getNumLinks();
	extern bool gDisableDeactivation;
    if (!m_canSleep || gDisableDeactivation) 
	{
		m_awake = true;
		m_sleepTimer = 0;
		return;
	}

    // motion is computed as omega^2 + v^2 + (sum of squares of joint velocities)
    btScalar motion = 0;
	{
		for (int i = 0; i < 6 + m_dofCount; ++i) 		
			motion += m_realBuf[i] * m_realBuf[i];
	}
	

    if (motion < SLEEP_EPSILON) {
        m_sleepTimer += timestep;
        if (m_sleepTimer > SLEEP_TIMEOUT) {
            goToSleep();
        }
    } else {
        m_sleepTimer = 0;
		if (!m_awake)
			wakeUp();
    }
}